

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int arg_parse(int argc,char **argv,void **argtable)

{
  char cVar1;
  byte bVar2;
  code *pcVar3;
  arg_end *endtable;
  void *pvVar4;
  long lVar5;
  char **nargv;
  size_t sVar6;
  char *pcVar7;
  int *__ptr;
  size_t sVar8;
  char *pcVar9;
  byte *pbVar10;
  void **ppvVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  bool bVar15;
  undefined4 *puVar16;
  long lVar17;
  long lVar18;
  int *piVar19;
  int *piVar20;
  void *pvVar22;
  arg_hdr **table;
  long lVar23;
  int *piVar21;
  
  ppvVar11 = argtable;
  do {
    pcVar3 = *(code **)((long)*ppvVar11 + 0x38);
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)(*(undefined8 *)((long)*ppvVar11 + 0x30));
    }
    pbVar10 = (byte *)*ppvVar11;
    ppvVar11 = ppvVar11 + 1;
  } while ((*pbVar10 & 1) == 0);
  lVar5 = -0x100000000;
  ppvVar11 = argtable;
  do {
    lVar5 = lVar5 + 0x100000000;
    pbVar10 = (byte *)*ppvVar11;
    ppvVar11 = ppvVar11 + 1;
  } while ((*pbVar10 & 1) == 0);
  endtable = *(arg_end **)((long)argtable + (lVar5 >> 0x1d));
  if (argc != 0) {
    nargv = (char **)malloc((long)argc * 8 + 8);
    if (nargv == (char **)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    if (0 < argc) {
      memcpy(nargv,argv,(ulong)(uint)argc << 3);
    }
    nargv[argc] = (char *)0x0;
    iVar12 = 1;
    lVar5 = 0;
    lVar23 = 0;
    do {
      pbVar10 = (byte *)argtable[lVar5];
      pcVar7 = *(char **)(pbVar10 + 0x10);
      if (pcVar7 == (char *)0x0) {
        lVar18 = 1;
      }
      else {
        sVar6 = strlen(pcVar7);
        lVar18 = sVar6 + 1;
        do {
          iVar12 = iVar12 + 1;
          pcVar7 = strchr(pcVar7 + 1,0x2c);
        } while (pcVar7 != (char *)0x0);
      }
      lVar23 = lVar23 + lVar18;
      lVar5 = lVar5 + 1;
    } while ((*pbVar10 & 1) == 0);
    __ptr = (int *)malloc(lVar23 + (long)iVar12 * 0x20 + 0x10);
    if (__ptr == (int *)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    *__ptr = 0;
    __ptr[1] = iVar12;
    *(int **)(__ptr + 2) = __ptr + 4;
    pbVar10 = (byte *)*argtable;
    if ((*pbVar10 & 1) == 0) {
      piVar19 = __ptr + 4 + (long)iVar12 * 8;
      lVar5 = 0;
      lVar23 = 0;
      do {
        pcVar7 = *(char **)(pbVar10 + 0x10);
        if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
          lVar23 = (long)(int)lVar23;
          piVar20 = piVar19;
          piVar21 = piVar19;
          do {
            while( true ) {
              piVar19 = (int *)((long)piVar20 + 1);
              cVar1 = *pcVar7;
              if ((cVar1 == '\0') || (cVar1 == ',')) break;
              pcVar7 = pcVar7 + 1;
              *(char *)piVar20 = cVar1;
              piVar20 = piVar19;
            }
            *(char *)piVar20 = '\0';
            cVar1 = *pcVar7;
            lVar18 = *(long *)(__ptr + 2);
            lVar17 = lVar23 * 0x20;
            *(int **)(lVar18 + lVar17) = piVar21;
            *(int **)(lVar18 + 0x10 + lVar17) = __ptr;
            *(int *)(lVar18 + 0x18 + lVar17) = (int)lVar5;
            if ((*argtable[lVar5] & 4) == 0) {
              puVar16 = (undefined4 *)(lVar18 + lVar17 + 8);
              if ((*argtable[lVar5] & 2) == 0) {
                *puVar16 = 0;
              }
              else {
                *puVar16 = 1;
              }
            }
            else {
              *(undefined4 *)(lVar18 + 8 + lVar17) = 2;
            }
            pcVar7 = pcVar7 + (cVar1 == ',');
            lVar23 = lVar23 + 1;
            piVar20 = piVar19;
            piVar21 = piVar19;
          } while (*pcVar7 != '\0');
        }
        pbVar10 = (byte *)argtable[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while ((*pbVar10 & 1) == 0);
      lVar5 = (long)(int)lVar23;
    }
    else {
      lVar5 = 0;
    }
    lVar23 = *(long *)(__ptr + 2);
    lVar5 = lVar5 * 0x20;
    *(undefined8 *)(lVar23 + lVar5) = 0;
    *(undefined4 *)(lVar23 + 8 + lVar5) = 0;
    *(undefined8 *)(lVar23 + 0x10 + lVar5) = 0;
    *(undefined4 *)(lVar23 + 0x18 + lVar5) = 0;
    pbVar10 = (byte *)*argtable;
    sVar6 = 2;
    bVar2 = *pbVar10;
    ppvVar11 = argtable;
    while ((bVar2 & 1) == 0) {
      ppvVar11 = ppvVar11 + 1;
      if (*(char **)(pbVar10 + 8) == (char *)0x0) {
        lVar5 = 0;
      }
      else {
        sVar8 = strlen(*(char **)(pbVar10 + 8));
        lVar5 = sVar8 * 3;
      }
      sVar6 = sVar6 + lVar5;
      pbVar10 = (byte *)*ppvVar11;
      bVar2 = *pbVar10;
    }
    pcVar7 = (char *)malloc(sVar6);
    if (pcVar7 == (char *)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    pcVar9 = pcVar7 + 1;
    *pcVar7 = ':';
    pbVar10 = (byte *)*argtable;
    if ((*pbVar10 & 1) == 0) {
      lVar5 = 0;
      do {
        pcVar14 = *(char **)(pbVar10 + 8);
        if (pcVar14 != (char *)0x0) {
          cVar1 = *pcVar14;
          while (cVar1 != '\0') {
            pcVar14 = pcVar14 + 1;
            *pcVar9 = cVar1;
            if ((*pbVar10 & 2) == 0) {
              pcVar9 = pcVar9 + 1;
            }
            else {
              pcVar9[1] = ':';
              pcVar9 = pcVar9 + 2;
            }
            if ((*pbVar10 & 4) != 0) {
              *pcVar9 = ':';
              pcVar9 = pcVar9 + 1;
            }
            cVar1 = *pcVar14;
          }
        }
        pbVar10 = (byte *)argtable[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while ((*pbVar10 & 1) == 0);
    }
    *pcVar9 = '\0';
    optind = 0;
    opterr = 0;
LAB_00108f99:
    while (iVar12 = getopt_internal(argc,nargv,pcVar7,*(option **)(__ptr + 2),(int *)0x0,1),
          0x39 < iVar12) {
      if (iVar12 == 0x3a) {
        arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
      }
      else {
        if (iVar12 != 0x3f) goto LAB_001090a2;
        if (optopt == 0) {
          arg_register_error(endtable,endtable,4,nargv[(long)optind + -1]);
        }
        else {
          arg_register_error(endtable,endtable,optopt,(char *)0x0);
        }
      }
    }
    if (iVar12 == 0) {
      iVar12 = *__ptr;
      pvVar22 = *(void **)((long)argtable[iVar12] + 0x30);
      if (((optarg != (char *)0x0) && (*optarg == '\0')) && ((*argtable[iVar12] & 2) != 0)) {
        arg_register_error(endtable,endtable,5,nargv[(long)optind + -1]);
      }
      if (*(code **)((long)argtable[iVar12] + 0x40) == (code *)0x0) goto LAB_00108f99;
      iVar12 = (**(code **)((long)argtable[iVar12] + 0x40))(pvVar22,optarg);
    }
    else {
      if (iVar12 == -1) goto LAB_00109175;
LAB_001090a2:
      pbVar10 = (byte *)*argtable;
      iVar13 = -1;
      if ((*pbVar10 & 1) == 0) {
        lVar5 = 0;
        do {
          if ((*(char **)(pbVar10 + 8) != (char *)0x0) &&
             (pcVar9 = strchr(*(char **)(pbVar10 + 8),(int)(char)iVar12), pcVar9 != (char *)0x0)) {
            iVar13 = (int)lVar5;
            break;
          }
          pbVar10 = (byte *)argtable[lVar5 + 1];
          lVar5 = lVar5 + 1;
          iVar13 = -1;
        } while ((*pbVar10 & 1) == 0);
      }
      if (iVar13 == -1) {
        arg_register_error(endtable,endtable,iVar12,(char *)0x0);
        goto LAB_00108f99;
      }
      pcVar3 = *(code **)((long)argtable[iVar13] + 0x40);
      if (pcVar3 == (code *)0x0) goto LAB_00108f99;
      pvVar22 = *(void **)((long)argtable[iVar13] + 0x30);
      iVar12 = (*pcVar3)(pvVar22,optarg);
    }
    if (iVar12 != 0) {
      arg_register_error(endtable,pvVar22,iVar12,optarg);
    }
    goto LAB_00108f99;
  }
  arg_parse_check((arg_hdr **)argtable,endtable);
  goto LAB_0010928d;
LAB_00109175:
  free(pcVar7);
  free(__ptr);
  pbVar10 = (byte *)*argtable;
  if ((*pbVar10 & 1) == 0) {
    iVar13 = 0;
    iVar12 = 0;
    pvVar22 = (void *)0x0;
    pcVar7 = (char *)0x0;
    do {
      bVar15 = true;
      if (optind < argc) {
        if (((*(long *)(pbVar10 + 0x10) == 0) && (*(long *)(pbVar10 + 8) == 0)) &&
           (*(code **)(pbVar10 + 0x40) != (code *)0x0)) {
          pvVar4 = *(void **)(pbVar10 + 0x30);
          iVar12 = (**(code **)(pbVar10 + 0x40))(pvVar4,nargv[optind]);
          if (iVar12 == 0) {
            optind = optind + 1;
            iVar12 = 0;
            bVar15 = false;
          }
          else {
            iVar13 = iVar13 + 1;
            pcVar7 = nargv[optind];
            bVar15 = false;
            pvVar22 = pvVar4;
          }
        }
        else {
          iVar13 = iVar13 + 1;
          bVar15 = false;
        }
      }
      if (bVar15) goto LAB_0010926b;
      pbVar10 = (byte *)argtable[iVar13];
    } while ((*pbVar10 & 1) == 0);
  }
  else {
    pcVar7 = (char *)0x0;
    pvVar22 = (void *)0x0;
    iVar12 = 0;
  }
  if (iVar12 != 0) {
    arg_register_error(endtable,pvVar22,iVar12,pcVar7);
    optind = optind + 1;
  }
  while (optind < argc) {
    lVar5 = (long)optind;
    optind = optind + 1;
    arg_register_error(endtable,endtable,3,nargv[lVar5]);
  }
LAB_0010926b:
  if (endtable->count == 0) {
    arg_parse_check((arg_hdr **)argtable,endtable);
  }
  free(nargv);
LAB_0010928d:
  return endtable->count;
}

Assistant:

int arg_parse(int argc, char** argv, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    struct arg_end* endtable;
    int endindex;
    char** argvcopy = NULL;
    int i;

    /*printf("arg_parse(%d,%p,%p)\n",argc,argv,argtable);*/

    /* reset any argtable data from previous invocations */
    arg_reset(argtable);

    /* locate the first end-of-table marker within the array */
    endindex = arg_endindex(table);
    endtable = (struct arg_end*)table[endindex];

    /* Special case of argc==0.  This can occur on Texas Instruments DSP. */
    /* Failure to trap this case results in an unwanted NULL result from  */
    /* the malloc for argvcopy (next code block).                         */
    if (argc == 0) {
        /* We must still perform post-parse checks despite the absence of command line arguments */
        arg_parse_check(table, endtable);

        /* Now we are finished */
        return endtable->count;
    }

    argvcopy = (char**)xmalloc(sizeof(char*) * (size_t)(argc + 1));

    /*
        Fill in the local copy of argv[]. We need a local copy
        because getopt rearranges argv[] which adversely affects
        susbsequent parsing attempts.
        */
    for (i = 0; i < argc; i++)
        argvcopy[i] = argv[i];

    argvcopy[argc] = NULL;

    /* parse the command line (local copy) for tagged options */
    arg_parse_tagged(argc, argvcopy, table, endtable);

    /* parse the command line (local copy) for untagged options */
    arg_parse_untagged(argc, argvcopy, table, endtable);

    /* if no errors so far then perform post-parse checks otherwise dont bother */
    if (endtable->count == 0)
        arg_parse_check(table, endtable);

    /* release the local copt of argv[] */
    xfree(argvcopy);

    return endtable->count;
}